

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void llhttp__debug(llhttp_t *s,char *p,char *endp,char *msg)

{
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  
  if (in_RSI == in_RDX) {
    fprintf(_stderr,"p=%p type=%d flags=%02x next=null debug=%s\n",in_RDI,
            (ulong)*(byte *)(in_RDI + 0x48),(ulong)*(ushort *)(in_RDI + 0x52),in_RCX);
  }
  else {
    fprintf(_stderr,"p=%p type=%d flags=%02x next=%02x   debug=%s\n",in_RDI,
            (ulong)*(byte *)(in_RDI + 0x48),(ulong)*(ushort *)(in_RDI + 0x52),
            (ulong)(uint)(int)*in_RSI);
  }
  return;
}

Assistant:

void llhttp__debug(llhttp_t* s, const char* p, const char* endp,
                   const char* msg) {
  if (p == endp) {
    fprintf(stderr, "p=%p type=%d flags=%02x next=null debug=%s\n", s, s->type,
            s->flags, msg);
  } else {
    fprintf(stderr, "p=%p type=%d flags=%02x next=%02x   debug=%s\n", s,
            s->type, s->flags, *p, msg);
  }
}